

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O0

void google::CaptureTestOutput(int fd,string *filename)

{
  bool bVar1;
  ostream *poVar2;
  unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_> local_108;
  byte local_f9;
  LogMessage local_f8;
  LogMessageVoidify local_95 [20];
  byte local_81;
  LogMessage local_80;
  LogMessageVoidify local_19;
  string *local_18;
  string *filename_local;
  int fd_local;
  
  local_81 = 0;
  local_18 = filename;
  filename_local._4_4_ = fd;
  if (fd != 1 && fd != 2) {
    LogMessageVoidify::LogMessageVoidify(&local_19);
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x15b);
    local_81 = 1;
    poVar2 = LogMessage::stream(&local_80);
    poVar2 = std::operator<<(poVar2,"Check failed: (fd == STDOUT_FILENO) || (fd == STDERR_FILENO) ")
    ;
    LogMessageVoidify::operator&(&local_19,poVar2);
  }
  if ((local_81 & 1) != 0) {
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_80);
  }
  bVar1 = std::operator==((unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_>
                           *)(s_captured_streams + (long)filename_local._4_4_ * 8),(nullptr_t)0x0);
  local_f9 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    LogMessageVoidify::LogMessageVoidify(local_95);
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x15c);
    local_f9 = 1;
    poVar2 = LogMessage::stream(&local_f8);
    poVar2 = std::operator<<(poVar2,"Check failed: s_captured_streams[fd] == nullptr ");
    LogMessageVoidify::operator&(local_95,poVar2);
  }
  if ((local_f9 & 1) == 0) {
    std::make_unique<google::CapturedStream,int&,std::__cxx11::string_const&>
              ((int *)&local_108,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&filename_local + 4));
    std::unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_>::operator=
              ((unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_> *)
               (s_captured_streams + (long)filename_local._4_4_ * 8),&local_108);
    std::unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_>::
    ~unique_ptr(&local_108);
    return;
  }
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_f8);
}

Assistant:

static inline void CaptureTestOutput(int fd, const string& filename) {
  CHECK((fd == STDOUT_FILENO) || (fd == STDERR_FILENO));
  CHECK(s_captured_streams[fd] == nullptr);
  s_captured_streams[fd] = std::make_unique<CapturedStream>(fd, filename);
}